

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O0

region * __thiscall toml::detail::repeat_at_least::scan(repeat_at_least *this,location *loc)

{
  bool bVar1;
  scanner_storage *in_RSI;
  region *in_RDI;
  region reg_1;
  location checkpoint;
  region reg;
  size_t i;
  location first;
  region *this_00;
  location *in_stack_fffffffffffffe78;
  location *in_stack_fffffffffffffe80;
  location *in_stack_fffffffffffffe88;
  region *in_stack_fffffffffffffe90;
  scanner_base *local_68;
  
  this_00 = in_RDI;
  location::location(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  for (local_68 = (scanner_base *)0x0;
      local_68 <
      in_RSI[1].scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
      local_68 = (scanner_base *)((long)&local_68->_vptr_scanner_base + 1)) {
    scanner_storage::scan(in_RSI,(location *)this_00);
    bVar1 = region::is_ok((region *)0x378add);
    if (!bVar1) {
      location::operator=((location *)this_00,(location *)in_RDI);
      region::region(in_stack_fffffffffffffe90);
    }
    region::~region(this_00);
    if (!bVar1) goto LAB_00378ccd;
  }
  do {
    bVar1 = location::eof((location *)this_00);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      region::region(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      break;
    }
    location::location(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    scanner_storage::scan(in_RSI,(location *)this_00);
    bVar1 = region::is_ok((region *)0x378beb);
    if (!bVar1) {
      location::operator=((location *)this_00,(location *)in_RDI);
      region::region(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    }
    region::~region(this_00);
    location::~location((location *)this_00);
  } while (bVar1);
LAB_00378ccd:
  location::~location((location *)this_00);
  return this_00;
}

Assistant:

TOML11_INLINE region repeat_at_least::scan(location& loc) const
{
    const auto first = loc;
    for(std::size_t i=0; i<length_; ++i)
    {
        const auto reg = other_.scan(loc);
        if( ! reg.is_ok())
        {
            loc = first;
            return region{};
        }
    }
    while( ! loc.eof())
    {
        const auto checkpoint = loc;
        const auto reg = other_.scan(loc);
        if( ! reg.is_ok())
        {
            loc = checkpoint;
            return region(first, loc);
        }
    }
    return region(first, loc);
}